

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

bool tinyxml2::XMLUtil::ToUnsigned(char *str,uint *value)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  bVar1 = *str;
  pcVar4 = str;
  while ((-1 < (char)bVar1 && (iVar2 = isspace((uint)bVar1), iVar2 != 0))) {
    bVar1 = pcVar4[1];
    pcVar4 = pcVar4 + 1;
  }
  if (*pcVar4 == '0') {
    pcVar3 = "%u";
    if ((pcVar4[1] & 0xdfU) == 0x58) {
      pcVar3 = "%x";
    }
  }
  else {
    pcVar3 = "%u";
  }
  iVar2 = __isoc99_sscanf(str,pcVar3,value);
  return iVar2 == 1;
}

Assistant:

bool XMLUtil::ToUnsigned(const char* str, unsigned* value)
{
    if (TIXML_SSCANF(str, IsPrefixHex(str) ? "%x" : "%u", value) == 1) {
        return true;
    }
    return false;
}